

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
* slang::ast::anon_unknown_0::getInterfacePortInfo
            (tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,Scope *scope,InterfacePortHeaderSyntax *header)

{
  group_type_pointer pgVar1;
  Compilation *this;
  DotMemberClauseSyntax *pDVar2;
  value_type_pointer pbVar3;
  ulong uVar4;
  byte bVar5;
  size_t __n;
  int iVar6;
  uint uVar7;
  uint64_t uVar8;
  Diagnostic *pDVar9;
  DefinitionSymbol *pDVar10;
  ulong uVar11;
  long lVar12;
  size_type __rlen;
  ulong uVar13;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  string_view sVar31;
  SourceRange SVar32;
  size_t pos;
  Token member;
  Token token;
  string_view local_b8;
  group_type_pointer local_a0;
  ulong local_98;
  ConfigBlockSymbol *local_90;
  SourceRange local_88;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  Token local_58;
  Token local_48;
  
  this = scope->compilation;
  local_48.kind = (header->nameOrKeyword).kind;
  local_48._2_1_ = (header->nameOrKeyword).field_0x2;
  local_48.numFlags.raw = (header->nameOrKeyword).numFlags.raw;
  local_48.rawLen = (header->nameOrKeyword).rawLen;
  local_48.info = (header->nameOrKeyword).info;
  sVar31 = parsing::Token::valueText(&local_48);
  local_88 = parsing::Token::range(&local_48);
  Compilation::getDefinition
            ((DefinitionLookupResult *)&local_b8,this,sVar31,scope,local_88,(DiagCode)0xce0006);
  pDVar10 = (DefinitionSymbol *)local_b8._M_len;
  if ((DefinitionSymbol *)local_b8._M_len != (DefinitionSymbol *)0x0) {
    if (((Symbol *)local_b8._M_len)->kind == Definition) {
      local_b8._M_len = 0;
      local_b8._M_str = (char *)0x0;
      if (*(DefinitionKind *)((long)pDVar10 + 0x48) == Interface) {
        pDVar2 = header->modport;
        if (pDVar2 != (DotMemberClauseSyntax *)0x0) {
          local_58.kind = (pDVar2->member).kind;
          local_58._2_1_ = (pDVar2->member).field_0x2;
          local_58.numFlags.raw = (pDVar2->member).numFlags.raw;
          local_58.rawLen = (pDVar2->member).rawLen;
          local_58.info = (pDVar2->member).info;
          local_b8 = parsing::Token::valueText(&local_58);
          uVar8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                            ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                             ((long)pDVar10 + 0x280),&local_b8);
          uVar11 = uVar8 >> ((byte)(((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->
                                   table_).
                                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                   .arrays.groups_size_index & 0x3f);
          local_a0 = (((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->table_).
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                     .arrays.groups_;
          lVar12 = (uVar8 & 0xff) * 4;
          uVar15 = (&UNK_00474b6c)[lVar12];
          uVar16 = (&UNK_00474b6d)[lVar12];
          uVar17 = (&UNK_00474b6e)[lVar12];
          bVar18 = (&UNK_00474b6f)[lVar12];
          __n = local_b8._M_len;
          local_90 = (ConfigBlockSymbol *)local_b8._M_str;
          local_98 = (ulong)((uint)uVar8 & 7);
          uVar13 = 0;
          uVar19 = uVar15;
          uVar20 = uVar16;
          uVar21 = uVar17;
          bVar22 = bVar18;
          uVar23 = uVar15;
          uVar24 = uVar16;
          uVar25 = uVar17;
          bVar26 = bVar18;
          uVar27 = uVar15;
          uVar28 = uVar16;
          uVar29 = uVar17;
          bVar30 = bVar18;
          do {
            pgVar1 = local_a0 + uVar11;
            local_68 = pgVar1->m[0].n;
            uStack_67 = pgVar1->m[1].n;
            uStack_66 = pgVar1->m[2].n;
            bStack_65 = pgVar1->m[3].n;
            uStack_64 = pgVar1->m[4].n;
            uStack_63 = pgVar1->m[5].n;
            uStack_62 = pgVar1->m[6].n;
            bStack_61 = pgVar1->m[7].n;
            uStack_60 = pgVar1->m[8].n;
            uStack_5f = pgVar1->m[9].n;
            uStack_5e = pgVar1->m[10].n;
            bStack_5d = pgVar1->m[0xb].n;
            uStack_5c = pgVar1->m[0xc].n;
            uStack_5b = pgVar1->m[0xd].n;
            uStack_5a = pgVar1->m[0xe].n;
            bVar5 = pgVar1->m[0xf].n;
            auVar14[0] = -(local_68 == uVar15);
            auVar14[1] = -(uStack_67 == uVar16);
            auVar14[2] = -(uStack_66 == uVar17);
            auVar14[3] = -(bStack_65 == bVar18);
            auVar14[4] = -(uStack_64 == uVar19);
            auVar14[5] = -(uStack_63 == uVar20);
            auVar14[6] = -(uStack_62 == uVar21);
            auVar14[7] = -(bStack_61 == bVar22);
            auVar14[8] = -(uStack_60 == uVar23);
            auVar14[9] = -(uStack_5f == uVar24);
            auVar14[10] = -(uStack_5e == uVar25);
            auVar14[0xb] = -(bStack_5d == bVar26);
            auVar14[0xc] = -(uStack_5c == uVar27);
            auVar14[0xd] = -(uStack_5b == uVar28);
            auVar14[0xe] = -(uStack_5a == uVar29);
            auVar14[0xf] = -(bVar5 == bVar30);
            uVar7 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
            bStack_59 = bVar5;
            if (uVar7 != 0) {
              pbVar3 = (((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.elements_;
              local_78 = uVar15;
              uStack_77 = uVar16;
              uStack_76 = uVar17;
              bStack_75 = bVar18;
              uStack_74 = uVar19;
              uStack_73 = uVar20;
              uStack_72 = uVar21;
              bStack_71 = bVar22;
              uStack_70 = uVar23;
              uStack_6f = uVar24;
              uStack_6e = uVar25;
              bStack_6d = bVar26;
              uStack_6c = uVar27;
              uStack_6b = uVar28;
              uStack_6a = uVar29;
              bStack_69 = bVar30;
              do {
                iVar6 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                  }
                }
                if (((Symbol *)__n ==
                     *(Symbol **)((long)&pbVar3[uVar11 * 0xf]._M_len + (ulong)(uint)(iVar6 << 4)))
                   && (((Symbol *)__n == (Symbol *)0x0 ||
                       (iVar6 = bcmp(local_90,*(void **)((long)&pbVar3[uVar11 * 0xf]._M_str +
                                                        (ulong)(uint)(iVar6 << 4)),__n),
                       uVar15 = local_78, uVar16 = uStack_77, uVar17 = uStack_76, bVar18 = bStack_75
                       , uVar19 = uStack_74, uVar20 = uStack_73, uVar21 = uStack_72,
                       bVar22 = bStack_71, uVar23 = uStack_70, uVar24 = uStack_6f,
                       uVar25 = uStack_6e, bVar26 = bStack_6d, uVar27 = uStack_6c,
                       uVar28 = uStack_6b, uVar29 = uStack_6a, bVar30 = bStack_69, iVar6 == 0))))
                goto LAB_0022a876;
                uVar7 = uVar7 - 1 & uVar7;
              } while (uVar7 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[local_98] & bVar5) == 0) break;
            uVar4 = (((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_size_mask;
            lVar12 = uVar11 + uVar13;
            uVar13 = uVar13 + 1;
            uVar11 = lVar12 + 1U & uVar4;
          } while (uVar13 <= uVar4);
          if ((Symbol *)__n != (Symbol *)0x0) {
            SVar32 = parsing::Token::range(&local_58);
            pDVar9 = Scope::addDiag(scope,(DiagCode)0x22000a,SVar32);
            Diagnostic::operator<<(pDVar9,local_b8);
            Diagnostic::operator<<(pDVar9,(pDVar10->super_Symbol).name);
            local_b8._M_len = 0;
            local_b8._M_str = (char *)0x0;
          }
        }
      }
      else {
        SVar32 = parsing::Token::range(&header->nameOrKeyword);
        pDVar9 = Scope::addDiag(scope,(DiagCode)0xa10006,SVar32);
        Diagnostic::operator<<(pDVar9,(pDVar10->super_Symbol).name);
        Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(pDVar10->super_Symbol).location);
        pDVar10 = (DefinitionSymbol *)0x0;
      }
LAB_0022a876:
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len = local_b8._M_len;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str = local_b8._M_str;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Head_base<0UL,_const_slang::ast::DefinitionSymbol_*,_false>._M_head_impl = pDVar10;
      return __return_storage_ptr__;
    }
    SVar32 = parsing::Token::range(&local_48);
    pDVar9 = Scope::addDiag(scope,(DiagCode)0xce0006,SVar32);
    sVar31 = parsing::Token::valueText(&local_48);
    Diagnostic::operator<<(pDVar9,sVar31);
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
  super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl =
       (basic_string_view<char,_std::char_traits<char>_>)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ).super__Head_base<0UL,_const_slang::ast::DefinitionSymbol_*,_false>._M_head_impl =
       (DefinitionSymbol *)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<const DefinitionSymbol*, std::string_view> getInterfacePortInfo(
    const Scope& scope, const InterfacePortHeaderSyntax& header) {

    auto& comp = scope.getCompilation();
    auto token = header.nameOrKeyword;
    auto def = comp.getDefinition(token.valueText(), scope, token.range(), diag::UnknownInterface)
                   .definition;
    if (!def || def->kind != SymbolKind::Definition) {
        // If we got a result then getDefinition didn't error, so do it ourselves.
        if (def)
            scope.addDiag(diag::UnknownInterface, token.range()) << token.valueText();
        return {nullptr, {}};
    }

    std::string_view modport;
    auto defSym = &def->as<DefinitionSymbol>();

    if (defSym->definitionKind != DefinitionKind::Interface) {
        auto& diag = scope.addDiag(diag::PortTypeNotInterfaceOrData, header.nameOrKeyword.range());
        diag << defSym->name;
        diag.addNote(diag::NoteDeclarationHere, defSym->location);
        defSym = nullptr;
    }
    else if (header.modport) {
        auto member = header.modport->member;
        modport = member.valueText();
        if (auto it = defSym->modports.find(modport);
            it == defSym->modports.end() && !modport.empty()) {
            auto& diag = scope.addDiag(diag::NotAModport, member.range());
            diag << modport;
            diag << defSym->name;
            modport = {};
        }
    }

    return {defSym, modport};
}